

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

undefined8 Catch::toString_abi_cxx11_(unsigned_long value)

{
  ostream *poVar1;
  void *this;
  ulong in_RSI;
  undefined8 in_RDI;
  ostringstream oss;
  ostringstream local_188 [376];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::ostream::operator<<(local_188,local_10);
  if (0xff < local_10) {
    poVar1 = std::operator<<((ostream *)local_188," (0x");
    this = (void *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(this,local_10);
    std::operator<<(poVar1,")");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string toString( unsigned long value ) {
    std::ostringstream oss;
    oss << value;
    if( value > Detail::hexThreshold )
        oss << " (0x" << std::hex << value << ")";
    return oss.str();
}